

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O2

ssize_t __thiscall UniValue::write_abi_cxx11_(UniValue *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint indentLevel;
  undefined4 in_register_00000034;
  UniValue *this_00;
  char *__s;
  long in_FS_OFFSET;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  this_00 = (UniValue *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(size_type **)this = &(this->val)._M_string_length;
  (this->val)._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&(this->val)._M_string_length = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,0x400);
  indentLevel = (int)__n + (uint)((int)__n == 0);
  __s = "null";
  switch(this_00->typ) {
  case VOBJ:
    writeObject(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VARR:
    writeArray(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VSTR:
    json_escape(&sStack_88,&this_00->val);
    std::operator+(&local_68,"\"",&sStack_88);
    std::operator+(&local_48,&local_68,"\"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    break;
  case VNUM:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               &this_00->val);
    break;
  case VBOOL:
    bVar1 = std::operator==(&this_00->val,"1");
    __s = "false";
    if (bVar1) {
      __s = "true";
    }
  case VNULL:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (ssize_t)this;
}

Assistant:

std::string UniValue::write(unsigned int prettyIndent,
                            unsigned int indentLevel) const
{
    std::string s;
    s.reserve(1024);

    unsigned int modIndent = indentLevel;
    if (modIndent == 0)
        modIndent = 1;

    switch (typ) {
    case VNULL:
        s += "null";
        break;
    case VOBJ:
        writeObject(prettyIndent, modIndent, s);
        break;
    case VARR:
        writeArray(prettyIndent, modIndent, s);
        break;
    case VSTR:
        s += "\"" + json_escape(val) + "\"";
        break;
    case VNUM:
        s += val;
        break;
    case VBOOL:
        s += (val == "1" ? "true" : "false");
        break;
    }

    return s;
}